

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_kv_functional_test.cc
# Opt level: O1

void multi_kv_custom_cmp_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  fdb_config *pfVar5;
  code *fconfig;
  char **kvs_names;
  char *unaff_RBP;
  char *pcVar6;
  fdb_config *pfVar7;
  char *unaff_R12;
  fdb_doc *doc_00;
  char *doc_01;
  char *unaff_R13;
  char *unaff_R14;
  fdb_custom_cmp_variable *functions;
  fdb_config *unaff_R15;
  fdb_config *doc_02;
  long lVar8;
  fdb_doc *doc;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *kv1;
  fdb_kvs_handle *db;
  fdb_kvs_handle *kv2;
  fdb_iterator *it;
  char value [256];
  timeval __test_begin;
  char key [256];
  char valueBuf [256];
  char keyBuf [256];
  timeval tStackY_1138;
  fdb_config fStackY_1128;
  fdb_file_handle *apfStackY_1030 [100];
  fdb_config *pfStackY_d10;
  fdb_custom_cmp_variable *pp_StackY_d08;
  fdb_config *pfStackY_d00;
  fdb_file_handle *pfStack_ce8;
  fdb_config *pfStack_ce0;
  fdb_kvs_handle *pfStack_cd8;
  fdb_kvs_config fStack_cd0;
  timeval tStack_cb8;
  char acStack_ca8 [264];
  fdb_config fStack_ba0;
  fdb_custom_cmp_variable ap_Stack_aa8 [33];
  char **ppcStack_9a0;
  fdb_doc *pfStack_998;
  fdb_config *pfStack_990;
  fdb_custom_cmp_variable *pp_Stack_988;
  fdb_config *pfStack_980;
  fdb_config *pfStack_978;
  undefined1 auStack_960 [24];
  fdb_kvs_handle *pfStack_948;
  fdb_kvs_handle *pfStack_940;
  fdb_kvs_config fStack_938;
  fdb_custom_cmp_variable p_Stack_920;
  code *pcStack_918;
  code *pcStack_910;
  char *pcStack_900;
  char *pcStack_8f8;
  char *pcStack_8f0;
  timeval tStack_8e0;
  fdb_config fStack_8d0;
  fdb_config fStack_7c8;
  fdb_custom_cmp_variable ap_Stack_6d0 [33];
  fdb_config *pfStack_5c8;
  fdb_config *pfStack_5c0;
  fdb_config *pfStack_5b8;
  fdb_config *pfStack_5b0;
  fdb_config *pfStack_5a8;
  fdb_config *pfStack_5a0;
  undefined1 local_590 [24];
  fdb_kvs_handle *local_578;
  fdb_kvs_handle *local_570;
  fdb_iterator *local_568;
  fdb_kvs_config local_560;
  fdb_config local_548;
  timeval local_448;
  fdb_config local_438;
  fdb_config local_330;
  fdb_custom_cmp_variable local_238 [32];
  char *local_138 [33];
  
  pfStack_5a0 = (fdb_config *)0x115167;
  gettimeofday(&local_448,(__timezone_ptr_t)0x0);
  local_548._0_8_ = 0x202066722d206d72;
  local_548.buffercache_size._0_2_ = 0x756d;
  local_548.buffercache_size._2_2_ = 0x746c;
  local_548.buffercache_size._4_3_ = 0x6b5f69;
  local_548.buffercache_size._7_1_ = 0x76;
  local_548.wal_threshold._0_7_ = 0x2a747365745f;
  pfStack_5a0 = (fdb_config *)0x115189;
  system((char *)&local_548);
  pfStack_5a0 = (fdb_config *)0x11518e;
  memleak_start();
  fconfig = (code *)&local_330;
  pfStack_5a0 = (fdb_config *)0x11519e;
  fdb_get_default_config();
  pfStack_5a0 = (fdb_config *)0x1151a8;
  fdb_get_default_kvs_config();
  local_330.seqtree_opt = '\x01';
  local_330.multi_kv_instances = true;
  local_330.wal_threshold = 0x100;
  local_330.wal_flush_before_commit = false;
  local_330.buffercache_size = 0;
  pfStack_5a0 = (fdb_config *)0x1151d8;
  fVar1 = fdb_open((fdb_file_handle **)(local_590 + 8),"./multi_kv_test",(fdb_config *)fconfig);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161f7;
  pfStack_5a0 = (fdb_config *)0x1151f6;
  fVar1 = fdb_kvs_open((fdb_file_handle *)local_590._8_8_,&local_578,(char *)0x0,&local_560);
  pfVar5 = (fdb_config *)fconfig;
  pfVar7 = (fdb_config *)unaff_RBP;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161fc;
  unaff_R14 = (char *)&local_438;
  unaff_R12 = "default";
  unaff_R13 = (char *)&local_548;
  pfVar7 = (fdb_config *)local_590;
  pfVar5 = (fdb_config *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x11522c;
    sprintf(unaff_R14,"key%06d",pfVar5);
    pfStack_5a0 = (fdb_config *)0x115242;
    sprintf(unaff_R13,"value%08d(%s)",pfVar5);
    pfStack_5a0 = (fdb_config *)0x11524a;
    sVar3 = strlen(unaff_R14);
    unaff_R15 = (fdb_config *)(sVar3 + 1);
    pfStack_5a0 = (fdb_config *)0x115256;
    sVar3 = strlen(unaff_R13);
    pfStack_5a0 = (fdb_config *)0x115273;
    fdb_doc_create((fdb_doc **)pfVar7,unaff_R14,(size_t)unaff_R15,(void *)0x0,0,unaff_R13,sVar3 + 1)
    ;
    pfStack_5a0 = (fdb_config *)0x115282;
    fVar1 = fdb_set(local_578,(fdb_doc *)local_590._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_5a0 = (fdb_config *)0x1160d2;
      multi_kv_custom_cmp_test();
      goto LAB_001160d2;
    }
    pfStack_5a0 = (fdb_config *)0x115294;
    fdb_doc_free((fdb_doc *)local_590._0_8_);
    uVar4 = (int)pfVar5 + 1;
    pfVar5 = (fdb_config *)(ulong)uVar4;
  } while (uVar4 != 1000);
  pfStack_5a0 = (fdb_config *)0x1152ae;
  fVar1 = fdb_commit((fdb_file_handle *)local_590._8_8_,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116201;
  local_560.custom_cmp = _multi_kv_test_keycmp;
  pfStack_5a0 = (fdb_config *)0x1152dc;
  fVar1 = fdb_kvs_open((fdb_file_handle *)local_590._8_8_,(fdb_kvs_handle **)(local_590 + 0x10),
                       "kv1",&local_560);
  fconfig = (code *)pfVar5;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116206;
  unaff_R14 = (char *)&local_438;
  unaff_R12 = "kv1_custom_cmp";
  unaff_R13 = (char *)&local_548;
  pfVar7 = (fdb_config *)local_590;
  fconfig = (code *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x115312;
    sprintf(unaff_R14,"key%06d",fconfig);
    pfStack_5a0 = (fdb_config *)0x115328;
    sprintf(unaff_R13,"value%08d(%s)",fconfig);
    pfStack_5a0 = (fdb_config *)0x115330;
    sVar3 = strlen(unaff_R14);
    unaff_R15 = (fdb_config *)(sVar3 + 1);
    pfStack_5a0 = (fdb_config *)0x11533c;
    sVar3 = strlen(unaff_R13);
    pfStack_5a0 = (fdb_config *)0x115359;
    fdb_doc_create((fdb_doc **)pfVar7,unaff_R14,(size_t)unaff_R15,(void *)0x0,0,unaff_R13,sVar3 + 1)
    ;
    pfStack_5a0 = (fdb_config *)0x115368;
    fVar1 = fdb_set((fdb_kvs_handle *)local_590._16_8_,(fdb_doc *)local_590._0_8_);
    pfVar5 = (fdb_config *)fconfig;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001160d2;
    pfStack_5a0 = (fdb_config *)0x11537a;
    fdb_doc_free((fdb_doc *)local_590._0_8_);
    uVar4 = (int)fconfig + 1;
    fconfig = (code *)(ulong)uVar4;
  } while (uVar4 != 1000);
  pfStack_5a0 = (fdb_config *)0x115394;
  fVar1 = fdb_commit((fdb_file_handle *)local_590._8_8_,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011620b;
  unaff_R15 = &local_438;
  pfVar7 = &local_548;
  unaff_R14 = local_590;
  unaff_R13 = (char *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x1153c5;
    sprintf((char *)unaff_R15,"key%06d",unaff_R13);
    pfStack_5a0 = (fdb_config *)0x1153e0;
    sprintf((char *)pfVar7,"value%08d(%s)",unaff_R13);
    pfStack_5a0 = (fdb_config *)0x1153e8;
    sVar3 = strlen((char *)unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115407;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R15,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115416;
    fVar1 = fdb_get(local_578,(fdb_doc *)local_590._0_8_);
    pfVar5 = (fdb_config *)local_590._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001160e4;
    unaff_R12 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115436;
    iVar2 = bcmp(pfVar7,unaff_R12,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_001160d7;
    pfStack_5a0 = (fdb_config *)0x115446;
    fdb_doc_free((fdb_doc *)pfVar5);
    pfStack_5a0 = (fdb_config *)0x115461;
    sprintf((char *)pfVar7,"value%08d(%s)",unaff_R13);
    pfStack_5a0 = (fdb_config *)0x115469;
    sVar3 = strlen((char *)unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115488;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R15,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115497;
    fVar1 = fdb_get((fdb_kvs_handle *)local_590._16_8_,(fdb_doc *)local_590._0_8_);
    fconfig = (code *)local_590._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001160f6;
    unaff_R12 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x1154b7;
    iVar2 = bcmp(pfVar7,unaff_R12,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_001160e9;
    pfStack_5a0 = (fdb_config *)0x1154c7;
    fdb_doc_free((fdb_doc *)fconfig);
    uVar4 = (int)unaff_R13 + 1;
    unaff_R13 = (char *)(ulong)uVar4;
  } while (uVar4 != 1000);
  pfStack_5a0 = (fdb_config *)0x1154e1;
  fVar1 = fdb_close((fdb_file_handle *)local_590._8_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116210;
  local_560.custom_cmp = (fdb_custom_cmp_variable)0x0;
  pfStack_5a0 = (fdb_config *)0x11550b;
  fVar1 = fdb_open((fdb_file_handle **)(local_590 + 8),"./multi_kv_test",&local_330);
  fconfig = _multi_kv_test_keycmp;
  if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00116215;
  local_138[0] = (char *)0x0;
  local_238[0] = _multi_kv_test_keycmp;
  pfStack_5a0 = (fdb_config *)0x115554;
  fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(local_590 + 8),"./multi_kv_test",&local_330,1,
                              local_138,local_238,(void **)0x0);
  if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_0011621a;
  local_138[0] = "kv1";
  local_238[0] = _multi_kv_test_keycmp;
  pfStack_5a0 = (fdb_config *)0x11559f;
  fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(local_590 + 8),"./multi_kv_test",&local_330,1,
                              local_138,local_238,(void **)0x0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011621f;
  pfStack_5a0 = (fdb_config *)0x1155bd;
  fVar1 = fdb_kvs_open((fdb_file_handle *)local_590._8_8_,&local_578,(char *)0x0,&local_560);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116224;
  pfStack_5a0 = (fdb_config *)0x1155e0;
  fVar1 = fdb_kvs_open((fdb_file_handle *)local_590._8_8_,(fdb_kvs_handle **)(local_590 + 0x10),
                       "kv1",&local_560);
  unaff_RBP = (char *)pfVar7;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116229;
  unaff_R14 = (char *)&local_438;
  unaff_R13 = (char *)&local_548;
  pfVar7 = (fdb_config *)local_590;
  unaff_R12 = (char *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x115611;
    sprintf(unaff_R14,"key%06d",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x11562c;
    sprintf(unaff_R13,"value%08d(%s)",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115634;
    sVar3 = strlen(unaff_R14);
    pfStack_5a0 = (fdb_config *)0x115653;
    fdb_doc_create((fdb_doc **)pfVar7,unaff_R14,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115662;
    fVar1 = fdb_get(local_578,(fdb_doc *)local_590._0_8_);
    pfVar5 = (fdb_config *)local_590._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116108;
    unaff_R15 = *(fdb_config **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115682;
    iVar2 = bcmp(unaff_R13,unaff_R15,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_001160fb;
    pfStack_5a0 = (fdb_config *)0x115692;
    fdb_doc_free((fdb_doc *)pfVar5);
    pfStack_5a0 = (fdb_config *)0x1156ad;
    sprintf(unaff_R13,"value%08d(%s)",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x1156b5;
    sVar3 = strlen(unaff_R14);
    pfStack_5a0 = (fdb_config *)0x1156d4;
    fdb_doc_create((fdb_doc **)pfVar7,unaff_R14,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x1156e3;
    fVar1 = fdb_get((fdb_kvs_handle *)local_590._16_8_,(fdb_doc *)local_590._0_8_);
    fconfig = (code *)local_590._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011611a;
    unaff_R15 = *(fdb_config **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115703;
    iVar2 = bcmp(unaff_R13,unaff_R15,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_0011610d;
    pfStack_5a0 = (fdb_config *)0x115713;
    fdb_doc_free((fdb_doc *)fconfig);
    uVar4 = (int)unaff_R12 + 1;
    unaff_R12 = (char *)(ulong)uVar4;
  } while (uVar4 != 1000);
  local_560.custom_cmp = (fdb_custom_cmp_variable)0x0;
  pfStack_5a0 = (fdb_config *)0x115746;
  fVar1 = fdb_kvs_open((fdb_file_handle *)local_590._8_8_,&local_570,"kv2",&local_560);
  unaff_RBP = (char *)pfVar7;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011622e;
  unaff_R14 = (char *)&local_438;
  unaff_R12 = "kv2";
  unaff_R13 = (char *)&local_548;
  unaff_RBP = local_590;
  fconfig = (code *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x11577c;
    sprintf(unaff_R14,"key%06d",fconfig);
    pfStack_5a0 = (fdb_config *)0x115792;
    sprintf(unaff_R13,"value%08d(%s)",fconfig);
    pfStack_5a0 = (fdb_config *)0x11579a;
    sVar3 = strlen(unaff_R14);
    unaff_R15 = (fdb_config *)(sVar3 + 1);
    pfStack_5a0 = (fdb_config *)0x1157a6;
    sVar3 = strlen(unaff_R13);
    pfStack_5a0 = (fdb_config *)0x1157c3;
    fdb_doc_create((fdb_doc **)unaff_RBP,unaff_R14,(size_t)unaff_R15,(void *)0x0,0,unaff_R13,
                   sVar3 + 1);
    pfStack_5a0 = (fdb_config *)0x1157d2;
    fVar1 = fdb_set(local_570,(fdb_doc *)local_590._0_8_);
    pfVar7 = (fdb_config *)unaff_RBP;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011611f;
    pfStack_5a0 = (fdb_config *)0x1157e4;
    fdb_doc_free((fdb_doc *)local_590._0_8_);
    uVar4 = (int)fconfig + 1;
    fconfig = (code *)(ulong)uVar4;
  } while (uVar4 != 1000);
  pfStack_5a0 = (fdb_config *)0x1157fe;
  fVar1 = fdb_commit((fdb_file_handle *)local_590._8_8_,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116233;
  unaff_R12 = (char *)&local_438;
  fconfig = (code *)&local_548;
  unaff_R14 = local_590;
  unaff_R15 = (fdb_config *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x11582f;
    sprintf(unaff_R12,"key%06d",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x11584a;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115852;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115871;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115880;
    fVar1 = fdb_get(local_578,(fdb_doc *)local_590._0_8_);
    pfVar7 = (fdb_config *)local_590._0_8_;
    pcVar6 = unaff_RBP;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116131;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x1158a0;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_00116124;
    pfStack_5a0 = (fdb_config *)0x1158b0;
    fdb_doc_free((fdb_doc *)pfVar7);
    pfStack_5a0 = (fdb_config *)0x1158cb;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x1158d3;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x1158f2;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115901;
    fVar1 = fdb_get((fdb_kvs_handle *)local_590._16_8_,(fdb_doc *)local_590._0_8_);
    pcVar6 = (char *)local_590._0_8_;
    unaff_RBP = (char *)pfVar7;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116143;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115921;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_00116136;
    pfStack_5a0 = (fdb_config *)0x115931;
    fdb_doc_free((fdb_doc *)pcVar6);
    pfStack_5a0 = (fdb_config *)0x11594c;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115954;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115973;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115982;
    fVar1 = fdb_get(local_570,(fdb_doc *)local_590._0_8_);
    unaff_RBP = (char *)local_590._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116155;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x1159a2;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_00116148;
    pfStack_5a0 = (fdb_config *)0x1159b2;
    fdb_doc_free((fdb_doc *)unaff_RBP);
    uVar4 = (int)unaff_R15 + 1;
    unaff_R15 = (fdb_config *)(ulong)uVar4;
  } while (uVar4 != 1000);
  unaff_R13 = (char *)&local_438;
  unaff_R15 = &local_548;
  unaff_R12 = (char *)0x0;
  do {
    unaff_R14 = local_590;
    pfStack_5a0 = (fdb_config *)0x1159ee;
    sprintf(unaff_R13,"key%06d",unaff_R12);
    pcVar6 = "value%08d(%s)";
    pfStack_5a0 = (fdb_config *)0x115a0c;
    sprintf((char *)unaff_R15,"value%08d(%s)",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115a14;
    sVar3 = strlen(unaff_R13);
    fconfig = (code *)(sVar3 + 1);
    pfStack_5a0 = (fdb_config *)0x115a20;
    sVar3 = strlen((char *)unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115a3d;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R13,(size_t)fconfig,(void *)0x0,0,unaff_R15,sVar3 + 1
                  );
    pfStack_5a0 = (fdb_config *)0x115a4c;
    fVar1 = fdb_set(local_578,(fdb_doc *)local_590._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011615a;
    pfStack_5a0 = (fdb_config *)0x115a5e;
    fdb_doc_free((fdb_doc *)local_590._0_8_);
    unaff_R14 = "key%06d";
    pfStack_5a0 = (fdb_config *)0x115a75;
    sprintf(unaff_R13,"key%06d",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115a8c;
    sprintf((char *)unaff_R15,"value%08d(%s)",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115a94;
    sVar3 = strlen(unaff_R13);
    fconfig = (code *)(sVar3 + 1);
    pfStack_5a0 = (fdb_config *)0x115aa0;
    sVar3 = strlen((char *)unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115abf;
    fdb_doc_create((fdb_doc **)local_590,unaff_R13,(size_t)fconfig,(void *)0x0,0,unaff_R15,sVar3 + 1
                  );
    pfStack_5a0 = (fdb_config *)0x115ace;
    fVar1 = fdb_set((fdb_kvs_handle *)local_590._16_8_,(fdb_doc *)local_590._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011615f;
    pfStack_5a0 = (fdb_config *)0x115ae0;
    fdb_doc_free((fdb_doc *)local_590._0_8_);
    unaff_RBP = "key%06d";
    pfStack_5a0 = (fdb_config *)0x115af6;
    sprintf(unaff_R13,"key%06d",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115b0d;
    sprintf((char *)unaff_R15,"value%08d(%s)",unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115b15;
    sVar3 = strlen(unaff_R13);
    fconfig = (code *)(sVar3 + 1);
    pfStack_5a0 = (fdb_config *)0x115b21;
    sVar3 = strlen((char *)unaff_R15);
    unaff_R14 = local_590;
    pfStack_5a0 = (fdb_config *)0x115b43;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R13,(size_t)fconfig,(void *)0x0,0,unaff_R15,sVar3 + 1
                  );
    pfStack_5a0 = (fdb_config *)0x115b52;
    fVar1 = fdb_set(local_570,(fdb_doc *)local_590._0_8_);
    pcVar6 = unaff_RBP;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116164;
    pfStack_5a0 = (fdb_config *)0x115b64;
    fdb_doc_free((fdb_doc *)local_590._0_8_);
    uVar4 = (int)unaff_R12 + 1;
    unaff_R12 = (char *)(ulong)uVar4;
  } while (uVar4 != 1000);
  pfStack_5a0 = (fdb_config *)0x115b80;
  fVar1 = fdb_commit((fdb_file_handle *)local_590._8_8_,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116238;
  unaff_R12 = (char *)&local_438;
  fconfig = (code *)&local_548;
  unaff_R14 = local_590;
  unaff_R15 = (fdb_config *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x115bb1;
    sprintf(unaff_R12,"key%06d",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115bcc;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115bd4;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115bf3;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115c02;
    fVar1 = fdb_get(local_578,(fdb_doc *)local_590._0_8_);
    pcVar6 = (char *)local_590._0_8_;
    pfVar7 = (fdb_config *)unaff_RBP;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116176;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115c22;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_00116169;
    pfStack_5a0 = (fdb_config *)0x115c32;
    fdb_doc_free((fdb_doc *)pcVar6);
    pfStack_5a0 = (fdb_config *)0x115c4d;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115c55;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115c74;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115c83;
    fVar1 = fdb_get((fdb_kvs_handle *)local_590._16_8_,(fdb_doc *)local_590._0_8_);
    pfVar7 = (fdb_config *)local_590._0_8_;
    unaff_RBP = pcVar6;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116188;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115ca3;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_0011617b;
    pfStack_5a0 = (fdb_config *)0x115cb3;
    fdb_doc_free((fdb_doc *)pfVar7);
    pfStack_5a0 = (fdb_config *)0x115cce;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115cd6;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115cf5;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115d04;
    fVar1 = fdb_get(local_570,(fdb_doc *)local_590._0_8_);
    unaff_RBP = (char *)local_590._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011619a;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115d24;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_0011618d;
    pfStack_5a0 = (fdb_config *)0x115d34;
    fdb_doc_free((fdb_doc *)unaff_RBP);
    uVar4 = (int)unaff_R15 + 1;
    unaff_R15 = (fdb_config *)(ulong)uVar4;
  } while (uVar4 != 1000);
  pfStack_5a0 = (fdb_config *)0x115d55;
  fVar1 = fdb_compact((fdb_file_handle *)local_590._8_8_,"./multi_kv_test2");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011623d;
  unaff_R12 = (char *)&local_438;
  fconfig = (code *)&local_548;
  unaff_R14 = local_590;
  unaff_R15 = (fdb_config *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x115d86;
    sprintf(unaff_R12,"key%06d",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115da1;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115da9;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115dc8;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115dd7;
    fVar1 = fdb_get(local_578,(fdb_doc *)local_590._0_8_);
    pfVar7 = (fdb_config *)local_590._0_8_;
    pfVar5 = (fdb_config *)unaff_RBP;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161ac;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115df7;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_0011619f;
    pfStack_5a0 = (fdb_config *)0x115e07;
    fdb_doc_free((fdb_doc *)pfVar7);
    pfStack_5a0 = (fdb_config *)0x115e22;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115e2a;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115e49;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115e58;
    fVar1 = fdb_get((fdb_kvs_handle *)local_590._16_8_,(fdb_doc *)local_590._0_8_);
    pfVar5 = (fdb_config *)local_590._0_8_;
    unaff_RBP = (char *)pfVar7;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161be;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115e78;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_001161b1;
    pfStack_5a0 = (fdb_config *)0x115e88;
    fdb_doc_free((fdb_doc *)pfVar5);
    pfStack_5a0 = (fdb_config *)0x115ea3;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_R15);
    pfStack_5a0 = (fdb_config *)0x115eab;
    sVar3 = strlen(unaff_R12);
    pfStack_5a0 = (fdb_config *)0x115eca;
    fdb_doc_create((fdb_doc **)unaff_R14,unaff_R12,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_5a0 = (fdb_config *)0x115ed9;
    fVar1 = fdb_get(local_570,(fdb_doc *)local_590._0_8_);
    unaff_RBP = (char *)local_590._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161d0;
    unaff_R13 = *(char **)(local_590._0_8_ + 0x40);
    pfStack_5a0 = (fdb_config *)0x115ef9;
    iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(local_590._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_001161c3;
    pfStack_5a0 = (fdb_config *)0x115f09;
    fdb_doc_free((fdb_doc *)unaff_RBP);
    uVar4 = (int)unaff_R15 + 1;
    unaff_R15 = (fdb_config *)(ulong)uVar4;
  } while (uVar4 != 1000);
  pfStack_5a0 = (fdb_config *)0x115f37;
  fVar1 = fdb_doc_create((fdb_doc **)local_590,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116242;
  *(char ***)(local_590._0_8_ + 0x20) = local_138;
  *(fdb_custom_cmp_variable **)(local_590._0_8_ + 0x40) = local_238;
  pfStack_5a0 = (fdb_config *)0x115f7c;
  fVar1 = fdb_iterator_init((fdb_kvs_handle *)local_590._16_8_,&local_568,(void *)0x0,0,(void *)0x0,
                            0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116247;
  unaff_R15 = &local_438;
  unaff_R13 = "kv1_custom_cmp(updated)";
  fconfig = (code *)&local_548;
  unaff_RBP = (char *)0x0;
  do {
    pfStack_5a0 = (fdb_config *)0x115fa9;
    fVar1 = fdb_iterator_get(local_568,(fdb_doc **)local_590);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161d5;
    pfStack_5a0 = (fdb_config *)0x115fc4;
    sprintf((char *)unaff_R15,"key%06d",unaff_RBP);
    pfStack_5a0 = (fdb_config *)0x115fda;
    sprintf((char *)fconfig,"value%08d(%s)",unaff_RBP,"kv1_custom_cmp(updated)");
    unaff_R12 = (char *)local_590._0_8_;
    unaff_R14 = *(char **)(local_590._0_8_ + 0x20);
    pfStack_5a0 = (fdb_config *)0x115ff3;
    iVar2 = bcmp(unaff_R14,unaff_R15,*(size_t *)local_590._0_8_);
    if (iVar2 != 0) goto LAB_001161da;
    unaff_R14 = *(char **)((long)unaff_R12 + 0x40);
    pfStack_5a0 = (fdb_config *)0x116010;
    iVar2 = bcmp(unaff_R14,fconfig,*(uint64_t *)((long)unaff_R12 + 0x10));
    if (iVar2 != 0) goto LAB_001161ea;
    uVar4 = (int)unaff_RBP + 1;
    unaff_RBP = (char *)(ulong)uVar4;
    pfStack_5a0 = (fdb_config *)0x116024;
    fVar1 = fdb_iterator_next(local_568);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  if (uVar4 != 1000) goto LAB_0011624c;
  pfStack_5a0 = (fdb_config *)0x116042;
  fVar1 = fdb_iterator_close(local_568);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116251;
  pfStack_5a0 = (fdb_config *)0x116054;
  fVar1 = fdb_close((fdb_file_handle *)local_590._8_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116256;
  pfStack_5a0 = (fdb_config *)0x116061;
  fVar1 = fdb_shutdown();
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011625b;
  *(undefined8 *)(local_590._0_8_ + 0x20) = 0;
  *(undefined8 *)(local_590._0_8_ + 0x40) = 0;
  pfStack_5a0 = (fdb_config *)0x11607d;
  fVar1 = fdb_doc_free((fdb_doc *)local_590._0_8_);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_5a0 = (fdb_config *)0x11608a;
    memleak_end();
    pcVar6 = "%s PASSED\n";
    if (multi_kv_custom_cmp_test()::__test_pass != '\0') {
      pcVar6 = "%s FAILED\n";
    }
    pfStack_5a0 = (fdb_config *)0x1160bb;
    fprintf(_stderr,pcVar6,"multiple KV instances custom comparison function test");
    return;
  }
  goto LAB_00116260;
LAB_001168fb:
  pfStack_978 = (fdb_config *)0x116900;
  multi_kv_fdb_open_custom_cmp_test();
LAB_00116900:
  pfStack_978 = (fdb_config *)0x116905;
  multi_kv_fdb_open_custom_cmp_test();
LAB_00116905:
  pfStack_978 = (fdb_config *)0x116915;
  multi_kv_fdb_open_custom_cmp_test();
  doc_00 = (fdb_doc *)doc_01;
LAB_00116915:
  pfStack_978 = (fdb_config *)0x11691a;
  multi_kv_fdb_open_custom_cmp_test();
LAB_0011691a:
  pfStack_978 = (fdb_config *)0x11692a;
  multi_kv_fdb_open_custom_cmp_test();
  pcVar6 = (char *)doc_00;
LAB_0011692a:
  pfStack_978 = (fdb_config *)0x11692f;
  multi_kv_fdb_open_custom_cmp_test();
LAB_0011692f:
  pfStack_978 = (fdb_config *)0x11693f;
  multi_kv_fdb_open_custom_cmp_test();
  doc_00 = (fdb_doc *)pcVar6;
LAB_0011693f:
  functions = ap_Stack_6d0;
  unaff_R13 = (char *)&fStack_8d0;
  unaff_RBP = auStack_960;
  pfStack_978 = (fdb_config *)0x116944;
  multi_kv_fdb_open_custom_cmp_test();
  goto LAB_00116944;
LAB_00116e7f:
  pfStackY_d00 = (fdb_config *)0x116e8c;
  multi_kv_use_existing_mode_test();
  pfVar7 = doc_02;
LAB_00116e8c:
  doc_02 = pfVar7;
  pfStackY_d00 = (fdb_config *)0x116e91;
  multi_kv_use_existing_mode_test();
LAB_00116e91:
  pfStackY_d00 = (fdb_config *)0x116e96;
  multi_kv_use_existing_mode_test();
LAB_00116e96:
  pfStackY_d00 = (fdb_config *)0x116ea3;
  multi_kv_use_existing_mode_test();
  pfVar7 = doc_02;
LAB_00116ea3:
  functions = ap_Stack_aa8;
  pfStackY_d00 = (fdb_config *)0x116ea8;
  multi_kv_use_existing_mode_test();
  goto LAB_00116ea8;
LAB_001160d2:
  unaff_R14 = (char *)&local_438;
  unaff_R13 = (char *)&local_548;
  pfVar7 = (fdb_config *)local_590;
  pfStack_5a0 = (fdb_config *)0x1160d7;
  multi_kv_custom_cmp_test();
LAB_001160d7:
  pfStack_5a0 = (fdb_config *)0x1160e4;
  multi_kv_custom_cmp_test();
  fconfig = (code *)pfVar5;
LAB_001160e4:
  pfStack_5a0 = (fdb_config *)0x1160e9;
  multi_kv_custom_cmp_test();
LAB_001160e9:
  pfStack_5a0 = (fdb_config *)0x1160f6;
  multi_kv_custom_cmp_test();
  pfVar5 = (fdb_config *)fconfig;
LAB_001160f6:
  pfStack_5a0 = (fdb_config *)0x1160fb;
  multi_kv_custom_cmp_test();
LAB_001160fb:
  pfStack_5a0 = (fdb_config *)0x116108;
  multi_kv_custom_cmp_test();
  fconfig = (code *)pfVar5;
LAB_00116108:
  pfStack_5a0 = (fdb_config *)0x11610d;
  multi_kv_custom_cmp_test();
LAB_0011610d:
  pfStack_5a0 = (fdb_config *)0x11611a;
  multi_kv_custom_cmp_test();
  pfVar5 = (fdb_config *)fconfig;
LAB_0011611a:
  fconfig = (code *)pfVar5;
  pfStack_5a0 = (fdb_config *)0x11611f;
  multi_kv_custom_cmp_test();
LAB_0011611f:
  pfStack_5a0 = (fdb_config *)0x116124;
  multi_kv_custom_cmp_test();
LAB_00116124:
  pfStack_5a0 = (fdb_config *)0x116131;
  multi_kv_custom_cmp_test();
  pcVar6 = (char *)pfVar7;
LAB_00116131:
  pfStack_5a0 = (fdb_config *)0x116136;
  multi_kv_custom_cmp_test();
LAB_00116136:
  pfStack_5a0 = (fdb_config *)0x116143;
  multi_kv_custom_cmp_test();
  unaff_RBP = pcVar6;
LAB_00116143:
  pfStack_5a0 = (fdb_config *)0x116148;
  multi_kv_custom_cmp_test();
LAB_00116148:
  pfStack_5a0 = (fdb_config *)0x116155;
  multi_kv_custom_cmp_test();
  pcVar6 = unaff_RBP;
LAB_00116155:
  pfStack_5a0 = (fdb_config *)0x11615a;
  multi_kv_custom_cmp_test();
LAB_0011615a:
  pfStack_5a0 = (fdb_config *)0x11615f;
  multi_kv_custom_cmp_test();
LAB_0011615f:
  pfStack_5a0 = (fdb_config *)0x116164;
  multi_kv_custom_cmp_test();
LAB_00116164:
  pfStack_5a0 = (fdb_config *)0x116169;
  multi_kv_custom_cmp_test();
LAB_00116169:
  pfStack_5a0 = (fdb_config *)0x116176;
  multi_kv_custom_cmp_test();
  pfVar7 = (fdb_config *)pcVar6;
LAB_00116176:
  pfStack_5a0 = (fdb_config *)0x11617b;
  multi_kv_custom_cmp_test();
LAB_0011617b:
  pfStack_5a0 = (fdb_config *)0x116188;
  multi_kv_custom_cmp_test();
  unaff_RBP = (char *)pfVar7;
LAB_00116188:
  pfStack_5a0 = (fdb_config *)0x11618d;
  multi_kv_custom_cmp_test();
LAB_0011618d:
  pfStack_5a0 = (fdb_config *)0x11619a;
  multi_kv_custom_cmp_test();
  pfVar7 = (fdb_config *)unaff_RBP;
LAB_0011619a:
  pfStack_5a0 = (fdb_config *)0x11619f;
  multi_kv_custom_cmp_test();
LAB_0011619f:
  pfStack_5a0 = (fdb_config *)0x1161ac;
  multi_kv_custom_cmp_test();
  pfVar5 = pfVar7;
LAB_001161ac:
  pfStack_5a0 = (fdb_config *)0x1161b1;
  multi_kv_custom_cmp_test();
LAB_001161b1:
  pfStack_5a0 = (fdb_config *)0x1161be;
  multi_kv_custom_cmp_test();
  unaff_RBP = (char *)pfVar5;
LAB_001161be:
  pfStack_5a0 = (fdb_config *)0x1161c3;
  multi_kv_custom_cmp_test();
LAB_001161c3:
  pfStack_5a0 = (fdb_config *)0x1161d0;
  multi_kv_custom_cmp_test();
  pfVar5 = (fdb_config *)unaff_RBP;
LAB_001161d0:
  unaff_RBP = (char *)pfVar5;
  pfStack_5a0 = (fdb_config *)0x1161d5;
  multi_kv_custom_cmp_test();
LAB_001161d5:
  pfStack_5a0 = (fdb_config *)0x1161da;
  multi_kv_custom_cmp_test();
LAB_001161da:
  pfStack_5a0 = (fdb_config *)0x1161ea;
  multi_kv_custom_cmp_test();
LAB_001161ea:
  pfStack_5a0 = (fdb_config *)0x1161f7;
  multi_kv_custom_cmp_test();
LAB_001161f7:
  pfStack_5a0 = (fdb_config *)0x1161fc;
  multi_kv_custom_cmp_test();
  pfVar5 = (fdb_config *)fconfig;
  pfVar7 = (fdb_config *)unaff_RBP;
LAB_001161fc:
  pfStack_5a0 = (fdb_config *)0x116201;
  multi_kv_custom_cmp_test();
LAB_00116201:
  pfStack_5a0 = (fdb_config *)0x116206;
  multi_kv_custom_cmp_test();
  fconfig = (code *)pfVar5;
LAB_00116206:
  pfStack_5a0 = (fdb_config *)0x11620b;
  multi_kv_custom_cmp_test();
LAB_0011620b:
  pfStack_5a0 = (fdb_config *)0x116210;
  multi_kv_custom_cmp_test();
LAB_00116210:
  pfStack_5a0 = (fdb_config *)0x116215;
  multi_kv_custom_cmp_test();
LAB_00116215:
  pfStack_5a0 = (fdb_config *)0x11621a;
  multi_kv_custom_cmp_test();
LAB_0011621a:
  pfStack_5a0 = (fdb_config *)0x11621f;
  multi_kv_custom_cmp_test();
LAB_0011621f:
  pfStack_5a0 = (fdb_config *)0x116224;
  multi_kv_custom_cmp_test();
LAB_00116224:
  pfStack_5a0 = (fdb_config *)0x116229;
  multi_kv_custom_cmp_test();
  unaff_RBP = (char *)pfVar7;
LAB_00116229:
  pfStack_5a0 = (fdb_config *)0x11622e;
  multi_kv_custom_cmp_test();
LAB_0011622e:
  pfStack_5a0 = (fdb_config *)0x116233;
  multi_kv_custom_cmp_test();
LAB_00116233:
  pfStack_5a0 = (fdb_config *)0x116238;
  multi_kv_custom_cmp_test();
LAB_00116238:
  pfStack_5a0 = (fdb_config *)0x11623d;
  multi_kv_custom_cmp_test();
LAB_0011623d:
  pfStack_5a0 = (fdb_config *)0x116242;
  multi_kv_custom_cmp_test();
LAB_00116242:
  pfStack_5a0 = (fdb_config *)0x116247;
  multi_kv_custom_cmp_test();
LAB_00116247:
  pfStack_5a0 = (fdb_config *)0x11624c;
  multi_kv_custom_cmp_test();
LAB_0011624c:
  pfStack_5a0 = (fdb_config *)0x116251;
  multi_kv_custom_cmp_test();
LAB_00116251:
  pfStack_5a0 = (fdb_config *)0x116256;
  multi_kv_custom_cmp_test();
LAB_00116256:
  pfStack_5a0 = (fdb_config *)0x11625b;
  multi_kv_custom_cmp_test();
LAB_0011625b:
  pfStack_5a0 = (fdb_config *)0x116260;
  multi_kv_custom_cmp_test();
LAB_00116260:
  pfStack_5a0 = (fdb_config *)multi_kv_fdb_open_custom_cmp_test;
  multi_kv_custom_cmp_test();
  doc_00 = (fdb_doc *)0x0;
  pfStack_978 = (fdb_config *)0x116288;
  pfStack_5c8 = (fdb_config *)fconfig;
  pfStack_5c0 = (fdb_config *)unaff_R12;
  pfStack_5b8 = (fdb_config *)unaff_R13;
  pfStack_5b0 = (fdb_config *)unaff_R14;
  pfStack_5a8 = unaff_R15;
  pfStack_5a0 = (fdb_config *)unaff_RBP;
  gettimeofday(&tStack_8e0,(__timezone_ptr_t)0x0);
  kvs_names = &pcStack_900;
  pcStack_8f0 = "kv2";
  pcStack_900 = "default";
  pcStack_8f8 = "kv1";
  functions = &p_Stack_920;
  pcStack_910 = (code *)0x0;
  p_Stack_920 = _multi_kv_test_keycmp;
  pcStack_918 = _multi_kv_test_keycmp;
  fStack_8d0.wal_threshold._0_1_ = '_';
  fStack_8d0.wal_threshold._1_1_ = 't';
  fStack_8d0.wal_threshold._2_1_ = 'e';
  fStack_8d0.wal_threshold._3_1_ = 's';
  fStack_8d0.wal_threshold._4_1_ = 't';
  fStack_8d0.wal_threshold._5_1_ = '*';
  fStack_8d0.wal_threshold._6_1_ = '\0';
  fStack_8d0._0_8_ = 0x202066722d206d72;
  fStack_8d0.buffercache_size._0_1_ = 'm';
  fStack_8d0.buffercache_size._1_1_ = 'u';
  fStack_8d0.buffercache_size._2_1_ = 'l';
  fStack_8d0.buffercache_size._3_1_ = 't';
  fStack_8d0.buffercache_size._4_1_ = 'i';
  fStack_8d0.buffercache_size._5_1_ = '_';
  fStack_8d0.buffercache_size._6_1_ = 'k';
  fStack_8d0.buffercache_size._7_1_ = 'v';
  pfStack_978 = (fdb_config *)0x1162e2;
  system((char *)&fStack_8d0);
  pfStack_978 = (fdb_config *)0x1162e7;
  memleak_start();
  pfVar7 = &fStack_7c8;
  pfStack_978 = (fdb_config *)0x1162f7;
  fdb_get_default_config();
  pfStack_978 = (fdb_config *)0x116301;
  fdb_get_default_kvs_config();
  fStack_7c8.seqtree_opt = '\x01';
  fStack_7c8.multi_kv_instances = true;
  fStack_7c8.wal_threshold = 0x100;
  fStack_7c8.wal_flush_before_commit = false;
  fStack_7c8.buffercache_size = 0;
  pfStack_978 = (fdb_config *)0x11633f;
  fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_960 + 8),"./multi_kv_test",pfVar7,3,
                              kvs_names,functions,(void **)0x0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_978 = (fdb_config *)0x11635d;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_960._8_8_,&pfStack_940,(char *)0x0,&fStack_938);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116949;
    pfStack_978 = (fdb_config *)0x116380;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_960._8_8_,&pfStack_948,"kv1",&fStack_938);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011694e;
    fStack_938.custom_cmp = _multi_kv_test_keycmp;
    pfStack_978 = (fdb_config *)0x1163ae;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_960._8_8_,
                         (fdb_kvs_handle **)(auStack_960 + 0x10),"kv2",&fStack_938);
    pcVar6 = (char *)doc_00;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116953;
    doc_01 = "default";
    kvs_names = (char **)0x0;
    do {
      pfStack_978 = (fdb_config *)0x1163e7;
      sprintf((char *)ap_Stack_6d0,"key%06d",kvs_names);
      pfStack_978 = (fdb_config *)0x1163fd;
      sprintf((char *)&fStack_8d0,"value%08d(%s)",kvs_names);
      pfStack_978 = (fdb_config *)0x116405;
      sVar3 = strlen((char *)ap_Stack_6d0);
      pfVar7 = (fdb_config *)(sVar3 + 1);
      pfStack_978 = (fdb_config *)0x116411;
      sVar3 = strlen((char *)&fStack_8d0);
      pfStack_978 = (fdb_config *)0x11642e;
      fdb_doc_create((fdb_doc **)auStack_960,ap_Stack_6d0,(size_t)pfVar7,(void *)0x0,0,&fStack_8d0,
                     sVar3 + 1);
      pfStack_978 = (fdb_config *)0x11643d;
      fVar1 = fdb_set(pfStack_940,(fdb_doc *)auStack_960._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStack_978 = (fdb_config *)0x1168fb;
        multi_kv_fdb_open_custom_cmp_test();
        goto LAB_001168fb;
      }
      pfStack_978 = (fdb_config *)0x11644f;
      fdb_doc_free((fdb_doc *)auStack_960._0_8_);
      uVar4 = (int)kvs_names + 1;
      kvs_names = (char **)(ulong)uVar4;
    } while (uVar4 != 1000);
    doc_01 = "kv1_custom_cmp";
    kvs_names = (char **)0x0;
    do {
      pfStack_978 = (fdb_config *)0x11648e;
      sprintf((char *)ap_Stack_6d0,"key%06d",kvs_names);
      pfStack_978 = (fdb_config *)0x1164a4;
      sprintf((char *)&fStack_8d0,"value%08d(%s)",kvs_names);
      pfStack_978 = (fdb_config *)0x1164ac;
      sVar3 = strlen((char *)ap_Stack_6d0);
      pfVar7 = (fdb_config *)(sVar3 + 1);
      pfStack_978 = (fdb_config *)0x1164b8;
      sVar3 = strlen((char *)&fStack_8d0);
      pfStack_978 = (fdb_config *)0x1164d5;
      fdb_doc_create((fdb_doc **)auStack_960,ap_Stack_6d0,(size_t)pfVar7,(void *)0x0,0,&fStack_8d0,
                     sVar3 + 1);
      pfStack_978 = (fdb_config *)0x1164e4;
      fVar1 = fdb_set(pfStack_948,(fdb_doc *)auStack_960._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001168fb;
      pfStack_978 = (fdb_config *)0x1164f6;
      fdb_doc_free((fdb_doc *)auStack_960._0_8_);
      uVar4 = (int)kvs_names + 1;
      kvs_names = (char **)(ulong)uVar4;
    } while (uVar4 != 1000);
    functions = ap_Stack_6d0;
    pcVar6 = "kv2";
    unaff_R13 = (char *)&fStack_8d0;
    unaff_RBP = auStack_960;
    kvs_names = (char **)0x0;
    do {
      pfStack_978 = (fdb_config *)0x116535;
      sprintf((char *)functions,"key%06d",kvs_names);
      pfStack_978 = (fdb_config *)0x11654b;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names);
      pfStack_978 = (fdb_config *)0x116553;
      sVar3 = strlen((char *)functions);
      pfVar7 = (fdb_config *)(sVar3 + 1);
      pfStack_978 = (fdb_config *)0x11655f;
      sVar3 = strlen(unaff_R13);
      pfStack_978 = (fdb_config *)0x11657c;
      fdb_doc_create((fdb_doc **)unaff_RBP,functions,(size_t)pfVar7,(void *)0x0,0,unaff_R13,
                     sVar3 + 1);
      pfStack_978 = (fdb_config *)0x11658b;
      fVar1 = fdb_set((fdb_kvs_handle *)auStack_960._16_8_,(fdb_doc *)auStack_960._0_8_);
      doc_01 = pcVar6;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116900;
      pfStack_978 = (fdb_config *)0x11659d;
      fdb_doc_free((fdb_doc *)auStack_960._0_8_);
      uVar4 = (int)kvs_names + 1;
      kvs_names = (char **)(ulong)uVar4;
    } while (uVar4 != 1000);
    pfStack_978 = (fdb_config *)0x1165b7;
    fVar1 = fdb_commit((fdb_file_handle *)auStack_960._8_8_,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116958;
    pfStack_978 = (fdb_config *)0x1165c9;
    fVar1 = fdb_close((fdb_file_handle *)auStack_960._8_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011695d;
    pfStack_978 = (fdb_config *)0x1165ea;
    fVar1 = fdb_open((fdb_file_handle **)(auStack_960 + 8),"./multi_kv_test",&fStack_7c8);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00116962;
    pfStack_978 = (fdb_config *)0x116622;
    fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_960 + 8),"./multi_kv_test",&fStack_7c8,
                                3,&pcStack_900,&p_Stack_920,(void **)0x0);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00116967;
    pcStack_910 = _multi_kv_test_keycmp;
    pfStack_978 = (fdb_config *)0x116665;
    fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_960 + 8),"./multi_kv_test",&fStack_7c8,
                                3,&pcStack_900,&p_Stack_920,(void **)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011696c;
    pfStack_978 = (fdb_config *)0x116683;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_960._8_8_,&pfStack_940,(char *)0x0,&fStack_938);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116971;
    pfStack_978 = (fdb_config *)0x1166a6;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_960._8_8_,&pfStack_948,"kv1",&fStack_938);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116976;
    pfStack_978 = (fdb_config *)0x1166c9;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_960._8_8_,
                         (fdb_kvs_handle **)(auStack_960 + 0x10),"kv2",&fStack_938);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011697b;
    functions = ap_Stack_6d0;
    unaff_R13 = (char *)&fStack_8d0;
    unaff_RBP = auStack_960;
    kvs_names = (char **)0x0;
    do {
      pfStack_978 = (fdb_config *)0x1166fb;
      sprintf((char *)functions,"key%06d",kvs_names);
      pfStack_978 = (fdb_config *)0x116715;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names);
      pfStack_978 = (fdb_config *)0x11671d;
      sVar3 = strlen((char *)functions);
      pfStack_978 = (fdb_config *)0x11673c;
      fdb_doc_create((fdb_doc **)unaff_RBP,functions,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_978 = (fdb_config *)0x11674b;
      fVar1 = fdb_get(pfStack_940,(fdb_doc *)auStack_960._0_8_);
      doc_01 = (char *)auStack_960._0_8_;
      doc_00 = (fdb_doc *)pcVar6;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116915;
      pfVar7 = *(fdb_config **)(auStack_960._0_8_ + 0x40);
      pfStack_978 = (fdb_config *)0x11676d;
      iVar2 = bcmp(unaff_R13,pfVar7,*(size_t *)(auStack_960._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_00116905;
      pfStack_978 = (fdb_config *)0x11677d;
      fdb_doc_free((fdb_doc *)doc_01);
      pfStack_978 = (fdb_config *)0x116797;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names);
      pfStack_978 = (fdb_config *)0x11679f;
      sVar3 = strlen((char *)functions);
      pfStack_978 = (fdb_config *)0x1167be;
      fdb_doc_create((fdb_doc **)unaff_RBP,functions,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_978 = (fdb_config *)0x1167cd;
      fVar1 = fdb_get(pfStack_948,(fdb_doc *)auStack_960._0_8_);
      doc_00 = (fdb_doc *)auStack_960._0_8_;
      pcVar6 = doc_01;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011692a;
      pfVar7 = *(fdb_config **)(auStack_960._0_8_ + 0x40);
      pfStack_978 = (fdb_config *)0x1167ef;
      iVar2 = bcmp(unaff_R13,pfVar7,*(size_t *)(auStack_960._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_0011691a;
      pfStack_978 = (fdb_config *)0x1167ff;
      fdb_doc_free(doc_00);
      pfStack_978 = (fdb_config *)0x116819;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names);
      pfStack_978 = (fdb_config *)0x116821;
      sVar3 = strlen((char *)functions);
      pfStack_978 = (fdb_config *)0x116840;
      fdb_doc_create((fdb_doc **)unaff_RBP,functions,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_978 = (fdb_config *)0x11684f;
      fVar1 = fdb_get((fdb_kvs_handle *)auStack_960._16_8_,(fdb_doc *)auStack_960._0_8_);
      pcVar6 = (char *)auStack_960._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011693f;
      pfVar7 = *(fdb_config **)(auStack_960._0_8_ + 0x40);
      pfStack_978 = (fdb_config *)0x116871;
      iVar2 = bcmp(unaff_R13,pfVar7,*(size_t *)(auStack_960._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_0011692f;
      pfStack_978 = (fdb_config *)0x116881;
      fdb_doc_free((fdb_doc *)pcVar6);
      uVar4 = (int)kvs_names + 1;
      kvs_names = (char **)(ulong)uVar4;
    } while (uVar4 != 1000);
    pfStack_978 = (fdb_config *)0x116899;
    fVar1 = fdb_close((fdb_file_handle *)auStack_960._8_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116980;
    pfStack_978 = (fdb_config *)0x1168a6;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_978 = (fdb_config *)0x1168b3;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (multi_kv_fdb_open_custom_cmp_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pfStack_978 = (fdb_config *)0x1168e4;
      fprintf(_stderr,pcVar6,"multiple KV instances fdb_open_custom_cmp test");
      return;
    }
  }
  else {
LAB_00116944:
    pfStack_978 = (fdb_config *)0x116949;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116949:
    pfStack_978 = (fdb_config *)0x11694e;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011694e:
    pfStack_978 = (fdb_config *)0x116953;
    multi_kv_fdb_open_custom_cmp_test();
    pcVar6 = (char *)doc_00;
LAB_00116953:
    pfStack_978 = (fdb_config *)0x116958;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116958:
    pfStack_978 = (fdb_config *)0x11695d;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011695d:
    pfStack_978 = (fdb_config *)0x116962;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116962:
    pfStack_978 = (fdb_config *)0x116967;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116967:
    pfStack_978 = (fdb_config *)0x11696c;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011696c:
    pfStack_978 = (fdb_config *)0x116971;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116971:
    pfStack_978 = (fdb_config *)0x116976;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116976:
    pfStack_978 = (fdb_config *)0x11697b;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011697b:
    pfStack_978 = (fdb_config *)0x116980;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116980:
    pfStack_978 = (fdb_config *)0x116985;
    multi_kv_fdb_open_custom_cmp_test();
  }
  pfStack_978 = (fdb_config *)multi_kv_use_existing_mode_test;
  multi_kv_fdb_open_custom_cmp_test();
  pfStackY_d00 = (fdb_config *)0x1169a7;
  ppcStack_9a0 = kvs_names;
  pfStack_998 = (fdb_doc *)pcVar6;
  pfStack_990 = (fdb_config *)unaff_R13;
  pp_Stack_988 = functions;
  pfStack_980 = pfVar7;
  pfStack_978 = (fdb_config *)unaff_RBP;
  gettimeofday(&tStack_cb8,(__timezone_ptr_t)0x0);
  builtin_strncpy(acStack_ca8,"rm -rf  multi_kv_test*",0x17);
  pfStackY_d00 = (fdb_config *)0x1169c9;
  system(acStack_ca8);
  pfStackY_d00 = (fdb_config *)0x1169ce;
  memleak_start();
  pfVar5 = &fStack_ba0;
  pfStackY_d00 = (fdb_config *)0x1169de;
  fdb_get_default_config();
  pfStackY_d00 = (fdb_config *)0x1169e8;
  fdb_get_default_kvs_config();
  fStack_ba0.seqtree_opt = '\x01';
  fStack_ba0.wal_threshold = 0x100;
  fStack_ba0.buffercache_size = 0;
  fStack_ba0.multi_kv_instances = true;
  pfStackY_d00 = (fdb_config *)0x116a14;
  fVar1 = fdb_open(&pfStack_ce8,"./multi_kv_test_multi",pfVar5);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStackY_d00 = (fdb_config *)0x116a32;
    fVar1 = fdb_kvs_open(pfStack_ce8,&pfStack_cd8,(char *)0x0,&fStack_cd0);
    doc_02 = pfVar7;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ead;
    functions = ap_Stack_aa8;
    pfVar5 = (fdb_config *)0x0;
    do {
      pfStackY_d00 = (fdb_config *)0x116a68;
      sprintf((char *)functions,"key%06d",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116a7e;
      sprintf(acStack_ca8,"value%08d(%s)",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116a86;
      sVar3 = strlen((char *)functions);
      doc_02 = (fdb_config *)(sVar3 + 1);
      pfStackY_d00 = (fdb_config *)0x116a92;
      sVar3 = strlen(acStack_ca8);
      pfStackY_d00 = (fdb_config *)0x116aaf;
      fdb_doc_create((fdb_doc **)&pfStack_ce0,functions,(size_t)doc_02,(void *)0x0,0,acStack_ca8,
                     sVar3 + 1);
      pfStackY_d00 = (fdb_config *)0x116abe;
      fVar1 = fdb_set(pfStack_cd8,(fdb_doc *)pfStack_ce0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStackY_d00 = (fdb_config *)0x116e7f;
        multi_kv_use_existing_mode_test();
        goto LAB_00116e7f;
      }
      pfStackY_d00 = (fdb_config *)0x116ad0;
      fdb_doc_free((fdb_doc *)pfStack_ce0);
      uVar4 = (int)pfVar5 + 1;
      pfVar5 = (fdb_config *)(ulong)uVar4;
    } while (uVar4 != 1000);
    pfStackY_d00 = (fdb_config *)0x116aea;
    fVar1 = fdb_commit(pfStack_ce8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116eb2;
    pfStackY_d00 = (fdb_config *)0x116afc;
    fVar1 = fdb_close(pfStack_ce8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116eb7;
    fStack_ba0.multi_kv_instances = false;
    pfStackY_d00 = (fdb_config *)0x116b21;
    fVar1 = fdb_open(&pfStack_ce8,"./multi_kv_test_multi",&fStack_ba0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ebc;
    pfStackY_d00 = (fdb_config *)0x116b3f;
    fVar1 = fdb_kvs_open(pfStack_ce8,&pfStack_cd8,(char *)0x0,&fStack_cd0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ec1;
    functions = ap_Stack_aa8;
    pfVar5 = (fdb_config *)0x0;
    pfVar7 = doc_02;
    do {
      pfStackY_d00 = (fdb_config *)0x116b6e;
      sprintf((char *)functions,"key%06d",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116b88;
      sprintf(acStack_ca8,"value%08d(%s)",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116b90;
      sVar3 = strlen((char *)functions);
      pfStackY_d00 = (fdb_config *)0x116baf;
      fdb_doc_create((fdb_doc **)&pfStack_ce0,functions,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStackY_d00 = (fdb_config *)0x116bbe;
      fVar1 = fdb_get(pfStack_cd8,(fdb_doc *)pfStack_ce0);
      doc_02 = pfStack_ce0;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116e8c;
      pfStackY_d00 = (fdb_config *)0x116bde;
      iVar2 = bcmp(acStack_ca8,*(void **)&pfStack_ce0->multi_kv_instances,pfStack_ce0->wal_threshold
                  );
      if (iVar2 != 0) goto LAB_00116e7f;
      pfStackY_d00 = (fdb_config *)0x116bee;
      fdb_doc_free((fdb_doc *)doc_02);
      uVar4 = (int)pfVar5 + 1;
      pfVar5 = (fdb_config *)(ulong)uVar4;
      pfVar7 = doc_02;
    } while (uVar4 != 1000);
    pfStackY_d00 = (fdb_config *)0x116c06;
    fVar1 = fdb_close(pfStack_ce8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ec6;
    fStack_ba0.multi_kv_instances = false;
    pfStackY_d00 = (fdb_config *)0x116c2b;
    fVar1 = fdb_open(&pfStack_ce8,"./multi_kv_test_single",&fStack_ba0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ecb;
    pfStackY_d00 = (fdb_config *)0x116c49;
    fVar1 = fdb_kvs_open(pfStack_ce8,&pfStack_cd8,(char *)0x0,&fStack_cd0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ed0;
    functions = ap_Stack_aa8;
    pfVar5 = (fdb_config *)0x0;
    do {
      pfStackY_d00 = (fdb_config *)0x116c7f;
      sprintf((char *)functions,"key%06d",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116c95;
      sprintf(acStack_ca8,"value%08d(%s)",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116c9d;
      sVar3 = strlen((char *)functions);
      doc_02 = (fdb_config *)(sVar3 + 1);
      pfStackY_d00 = (fdb_config *)0x116ca9;
      sVar3 = strlen(acStack_ca8);
      pfStackY_d00 = (fdb_config *)0x116cc6;
      fdb_doc_create((fdb_doc **)&pfStack_ce0,functions,(size_t)doc_02,(void *)0x0,0,acStack_ca8,
                     sVar3 + 1);
      pfStackY_d00 = (fdb_config *)0x116cd5;
      fVar1 = fdb_set(pfStack_cd8,(fdb_doc *)pfStack_ce0);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116e91;
      pfStackY_d00 = (fdb_config *)0x116ce7;
      fdb_doc_free((fdb_doc *)pfStack_ce0);
      uVar4 = (int)pfVar5 + 1;
      pfVar5 = (fdb_config *)(ulong)uVar4;
    } while (uVar4 != 1000);
    pfStackY_d00 = (fdb_config *)0x116d01;
    fVar1 = fdb_commit(pfStack_ce8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ed5;
    pfStackY_d00 = (fdb_config *)0x116d13;
    fVar1 = fdb_close(pfStack_ce8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116eda;
    fStack_ba0.multi_kv_instances = true;
    pfStackY_d00 = (fdb_config *)0x116d38;
    fVar1 = fdb_open(&pfStack_ce8,"./multi_kv_test_single",&fStack_ba0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116edf;
    pfStackY_d00 = (fdb_config *)0x116d56;
    fVar1 = fdb_kvs_open(pfStack_ce8,&pfStack_cd8,(char *)0x0,&fStack_cd0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ee4;
    functions = ap_Stack_aa8;
    pfVar5 = (fdb_config *)0x0;
    pfVar7 = doc_02;
    do {
      pfStackY_d00 = (fdb_config *)0x116d85;
      sprintf((char *)functions,"key%06d",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116d9f;
      sprintf(acStack_ca8,"value%08d(%s)",pfVar5);
      pfStackY_d00 = (fdb_config *)0x116da7;
      sVar3 = strlen((char *)functions);
      pfStackY_d00 = (fdb_config *)0x116dc6;
      fdb_doc_create((fdb_doc **)&pfStack_ce0,functions,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStackY_d00 = (fdb_config *)0x116dd5;
      fVar1 = fdb_get(pfStack_cd8,(fdb_doc *)pfStack_ce0);
      doc_02 = pfStack_ce0;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ea3;
      pfStackY_d00 = (fdb_config *)0x116df5;
      iVar2 = bcmp(acStack_ca8,*(void **)&pfStack_ce0->multi_kv_instances,pfStack_ce0->wal_threshold
                  );
      if (iVar2 != 0) goto LAB_00116e96;
      pfStackY_d00 = (fdb_config *)0x116e05;
      fdb_doc_free((fdb_doc *)doc_02);
      uVar4 = (int)pfVar5 + 1;
      pfVar5 = (fdb_config *)(ulong)uVar4;
      pfVar7 = doc_02;
    } while (uVar4 != 1000);
    pfStackY_d00 = (fdb_config *)0x116e1d;
    fVar1 = fdb_close(pfStack_ce8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStackY_d00 = (fdb_config *)0x116e2a;
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pfStackY_d00 = (fdb_config *)0x116e37;
        memleak_end();
        pcVar6 = "%s PASSED\n";
        if (multi_kv_use_existing_mode_test()::__test_pass != '\0') {
          pcVar6 = "%s FAILED\n";
        }
        pfStackY_d00 = (fdb_config *)0x116e68;
        fprintf(_stderr,pcVar6,"multiple KV instances use existing mode test");
        return;
      }
      goto LAB_00116eee;
    }
  }
  else {
LAB_00116ea8:
    pfStackY_d00 = (fdb_config *)0x116ead;
    multi_kv_use_existing_mode_test();
    doc_02 = pfVar7;
LAB_00116ead:
    pfStackY_d00 = (fdb_config *)0x116eb2;
    multi_kv_use_existing_mode_test();
LAB_00116eb2:
    pfStackY_d00 = (fdb_config *)0x116eb7;
    multi_kv_use_existing_mode_test();
LAB_00116eb7:
    pfStackY_d00 = (fdb_config *)0x116ebc;
    multi_kv_use_existing_mode_test();
LAB_00116ebc:
    pfStackY_d00 = (fdb_config *)0x116ec1;
    multi_kv_use_existing_mode_test();
LAB_00116ec1:
    pfStackY_d00 = (fdb_config *)0x116ec6;
    multi_kv_use_existing_mode_test();
LAB_00116ec6:
    pfStackY_d00 = (fdb_config *)0x116ecb;
    multi_kv_use_existing_mode_test();
LAB_00116ecb:
    pfStackY_d00 = (fdb_config *)0x116ed0;
    multi_kv_use_existing_mode_test();
LAB_00116ed0:
    pfStackY_d00 = (fdb_config *)0x116ed5;
    multi_kv_use_existing_mode_test();
LAB_00116ed5:
    pfStackY_d00 = (fdb_config *)0x116eda;
    multi_kv_use_existing_mode_test();
LAB_00116eda:
    pfStackY_d00 = (fdb_config *)0x116edf;
    multi_kv_use_existing_mode_test();
LAB_00116edf:
    pfStackY_d00 = (fdb_config *)0x116ee4;
    multi_kv_use_existing_mode_test();
LAB_00116ee4:
    pfStackY_d00 = (fdb_config *)0x116ee9;
    multi_kv_use_existing_mode_test();
  }
  pfStackY_d00 = (fdb_config *)0x116eee;
  multi_kv_use_existing_mode_test();
LAB_00116eee:
  pfStackY_d00 = (fdb_config *)_opening_thread;
  multi_kv_use_existing_mode_test();
  pfStackY_d10 = pfVar5;
  pp_StackY_d08 = functions;
  pfStackY_d00 = doc_02;
  fdb_get_default_config();
  lVar8 = 0;
  gettimeofday(&tStackY_1138,(__timezone_ptr_t)0x0);
  do {
    fVar1 = fdb_open((fdb_file_handle **)((long)apfStackY_1030 + lVar8),"multi_kv_test2",
                     &fStackY_1128);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x92d);
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x92d,"void *_opening_thread(void *)");
    }
    lVar8 = lVar8 + 8;
  } while (lVar8 != 800);
  lVar8 = 0;
  do {
    fVar1 = fdb_close(apfStackY_1030[lVar8]);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x931);
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x931,"void *_opening_thread(void *)");
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 100);
  pthread_exit((void *)0x0);
}

Assistant:

void multi_kv_custom_cmp_test()
{
    TEST_INIT();

    int n = 1000;
    int i, r;
    char key[256], value[256];
    char keyBuf[256], valueBuf[256];
    char keystr[] = "key%06d";
    char valuestr[] = "value%08d(%s)";
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1, *kv2;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc;
    fdb_iterator *it;
    fdb_status s;

    sprintf(value, SHELL_DEL" multi_kv_test*");
    r = system(value);
    (void)r;

    memleak_start();

    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    config.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    config.multi_kv_instances = true;
    config.wal_threshold = 256;
    config.wal_flush_before_commit = false;
    config.buffercache_size = 0;

    s = fdb_open(&dbfile, "./multi_kv_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert using 'default' instance
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // create 'kv1' using custom cmp function
    kvs_config.custom_cmp = _multi_kv_test_keycmp;
    s = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert using 'kv1' instance
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // close & reopen handles
    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    kvs_config.custom_cmp = NULL;
    s = fdb_open(&dbfile, "./multi_kv_test", &config);
    TEST_CHK(s != FDB_RESULT_SUCCESS); // must fail

    { // retry with wrong cmp function
        char *kvs_names[] = {NULL};
        fdb_custom_cmp_variable functions[] = {_multi_kv_test_keycmp};
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                1, kvs_names, functions, NULL);
        TEST_CHK(s != FDB_RESULT_SUCCESS); // must fail
    }

    { // retry with correct function
        char *kvs_names[] = {(char*)"kv1"};
        fdb_custom_cmp_variable functions[] = {_multi_kv_test_keycmp};
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                1, kvs_names, functions, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS); // must succeed this time
    }

    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // create one more KV store
    kvs_config.custom_cmp = NULL;
    s = fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert using 'kv2' instance
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv2");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv2");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // update all documents
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);

        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);

        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv2(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    // WAL flush at once
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv2(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // do compaction
    s = fdb_compact(dbfile, "./multi_kv_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv2(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // pre-allocate memory and re-use it for the iterator return document
    s = fdb_doc_create(&doc, NULL, 0, NULL, 0, NULL, 0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    doc->key = &keyBuf[0];
    doc->body = &valueBuf[0];

    // create full iterator for 'kv1'
    i = 0;
    s = fdb_iterator_init(kv1, &it, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    do {
        s = fdb_iterator_get(it, &doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        TEST_CMP(doc->key, key, doc->keylen);
        TEST_CMP(doc->body, value, doc->bodylen);
        i++;
    } while (fdb_iterator_next(it) == FDB_RESULT_SUCCESS);
    TEST_CHK(i == n);
    s = fdb_iterator_close(it);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    // release the pre-allocated memory for the iterator return document
    doc->key = NULL;
    doc->body = NULL;
    s = fdb_doc_free(doc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    memleak_end();

    TEST_RESULT("multiple KV instances custom comparison function test");
}